

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::
~TreeEnsembleParameters_TreeNode_EvaluationInfo
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this)

{
  Arena *pAVar1;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (pAVar1 == (Arena *)0x0) {
    SharedDtor(this);
    google::protobuf::internal::InternalMetadata::Delete<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_);
  }
  google::protobuf::MessageLite::~MessageLite(&this->super_MessageLite);
  return;
}

Assistant:

TreeEnsembleParameters_TreeNode_EvaluationInfo::~TreeEnsembleParameters_TreeNode_EvaluationInfo() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}